

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void destroy_charmaps(FT_Face face,FT_Memory memory)

{
  FT_CMap_conflict cmap;
  FT_Int n;
  FT_Memory memory_local;
  FT_Face face_local;
  
  if (face != (FT_Face)0x0) {
    for (cmap._4_4_ = 0; cmap._4_4_ < face->num_charmaps; cmap._4_4_ = cmap._4_4_ + 1) {
      ft_cmap_done_internal((FT_CMap_conflict)face->charmaps[cmap._4_4_]);
      face->charmaps[cmap._4_4_] = (FT_CharMap)0x0;
    }
    ft_mem_free(memory,face->charmaps);
    face->charmaps = (FT_CharMap *)0x0;
    face->num_charmaps = 0;
  }
  return;
}

Assistant:

static void
  destroy_charmaps( FT_Face    face,
                    FT_Memory  memory )
  {
    FT_Int  n;


    if ( !face )
      return;

    for ( n = 0; n < face->num_charmaps; n++ )
    {
      FT_CMap  cmap = FT_CMAP( face->charmaps[n] );


      ft_cmap_done_internal( cmap );

      face->charmaps[n] = NULL;
    }

    FT_FREE( face->charmaps );
    face->num_charmaps = 0;
  }